

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  int *piVar4;
  Allocator *pAVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Deconvolution *pDVar14;
  Option *opt_00;
  Mat *dst;
  pointer piVar15;
  int iVar16;
  uint uVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar18;
  void *pvVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  size_t __size;
  long lVar23;
  int iVar24;
  void *pvVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  int size_1;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  uint uVar34;
  undefined4 uVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Mat local_1d8;
  Mat local_198;
  Deconvolution *local_150;
  ulong local_148;
  ulong local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  Option *local_128;
  Mat *local_120;
  float *local_118;
  long local_110;
  ulong local_108;
  long local_100;
  int size_3;
  void *local_f0;
  ulong local_e8;
  ulong local_e0;
  void *local_d8;
  void *local_d0;
  ulong local_c8;
  int remain;
  long local_b8;
  long local_b0;
  ulong local_a8;
  Mat *local_a0;
  void *local_98;
  long local_90;
  void *local_88;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_b;
  
  local_e0 = (ulong)(uint)bottom_blob->w;
  local_e8 = (ulong)(uint)bottom_blob->h;
  uVar3 = bottom_blob->c;
  uVar18 = bottom_blob->elemsize;
  iVar30 = (this->kernel_w + -1) * this->dilation_w + (bottom_blob->w - 1U) * this->stride_w + 1;
  iVar16 = (bottom_blob->h - 1U) * this->stride_h;
  iVar27 = (this->kernel_h + -1) * this->dilation_h + iVar16 + 1;
  local_1d8.elemsize = 0;
  local_1d8.elempack = 0;
  local_1d8.data = (void *)0x0;
  local_1d8.refcount._0_4_ = 0;
  local_1d8.refcount._4_4_ = 0;
  local_1d8.allocator = (Allocator *)0x0;
  local_1d8.dims = 0;
  local_1d8.w = 0;
  local_1d8.h = 0;
  local_1d8.c = 0;
  local_1d8.cstep = 0;
  auVar37._0_4_ = -(uint)(0 < this->pad_left);
  auVar37._4_4_ = -(uint)(0 < this->pad_right);
  auVar37._8_4_ = -(uint)(0 < this->pad_top);
  auVar37._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar16 = movmskps(iVar16,auVar37);
  local_150 = this;
  local_128 = opt;
  local_120 = top_blob;
  local_a0 = bottom_blob;
  if ((((iVar16 == 0) && (this->output_pad_right < 1)) && (this->output_pad_bottom < 1)) &&
     ((this->output_w < 1 || (this->output_h < 1)))) {
    if (&local_1d8 != top_blob) {
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_1d8.data = top_blob->data;
      local_1d8.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_1d8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_1d8.elemsize = top_blob->elemsize;
      local_1d8.elempack = top_blob->elempack;
      local_1d8.allocator = top_blob->allocator;
      uVar9 = top_blob->dims;
      uVar10 = top_blob->w;
      uVar11 = top_blob->h;
      uVar12 = top_blob->c;
      local_1d8.cstep = top_blob->cstep;
      local_1d8.dims = uVar9;
      local_1d8.w = uVar10;
      local_1d8.h = uVar11;
      local_1d8.c = uVar12;
    }
    iVar16 = this->num_output;
    pAVar5 = opt->blob_allocator;
    auVar39._0_4_ = -(uint)(local_1d8.dims == 3);
    auVar39._4_4_ = -(uint)(iVar30 == local_1d8.w);
    auVar39._8_4_ = -(uint)(iVar27 == local_1d8.h);
    auVar39._12_4_ = -(uint)(iVar16 == local_1d8.c);
    iVar22 = movmskps((int)opt,auVar39);
    if (((iVar22 != 0xf) || (local_1d8.elempack != 1)) ||
       ((local_1d8.allocator != pAVar5 || (local_1d8.elemsize != uVar18)))) {
      piVar4 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_1d8.allocator == (Allocator *)0x0) {
            if (local_1d8.data != (void *)0x0) {
              free(local_1d8.data);
            }
          }
          else {
            (*(local_1d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1d8.data = (void *)0x0;
      local_1d8.refcount._0_4_ = 0;
      local_1d8.refcount._4_4_ = 0;
      local_1d8.refcount = (int *)0x0;
      local_1d8.elempack = 1;
      local_1d8.dims = 3;
      local_1d8.cstep = ((long)(iVar27 * iVar30) * uVar18 + 0xf & 0xfffffffffffffff0) / uVar18;
      local_1d8.elemsize = uVar18;
      local_1d8.allocator = pAVar5;
      local_1d8.w = iVar30;
      local_1d8.h = iVar27;
      local_1d8.c = iVar16;
      if ((long)iVar16 * local_1d8.cstep != 0) {
        uVar32 = (long)iVar16 * local_1d8.cstep * uVar18 + 3 & 0xfffffffffffffffc;
        __size = uVar32 + 4;
        if (pAVar5 == (Allocator *)0x0) goto LAB_0013d7bc;
        iVar16 = (*pAVar5->_vptr_Allocator[2])(pAVar5,__size);
        local_1d8.data = (void *)CONCAT44(extraout_var_00,iVar16);
        goto LAB_0013d7e4;
      }
    }
  }
  else {
    local_1d8.c = this->num_output;
    local_1d8.allocator = opt->workspace_allocator;
    auVar42._4_4_ = -(uint)(iVar27 == 0);
    auVar42._0_4_ = -(uint)(iVar30 == 0);
    auVar42._8_4_ = -(uint)(local_1d8.c == 0);
    auVar42._12_4_ = 0;
    movmskps((int)opt,auVar42 << 0x20);
    local_1d8.data = (void *)0x0;
    local_1d8.refcount._0_4_ = 0;
    local_1d8.refcount._4_4_ = 0;
    local_1d8.refcount = (int *)0x0;
    local_1d8.elempack = 1;
    local_1d8.dims = 3;
    local_1d8.cstep = ((long)(iVar27 * iVar30) * uVar18 + 0xf & 0xfffffffffffffff0) / uVar18;
    local_1d8.elemsize = uVar18;
    local_1d8.w = iVar30;
    local_1d8.h = iVar27;
    if ((long)local_1d8.c * local_1d8.cstep != 0) {
      uVar32 = (long)local_1d8.c * local_1d8.cstep * uVar18 + 3 & 0xfffffffffffffffc;
      __size = uVar32 + 4;
      if (local_1d8.allocator == (Allocator *)0x0) {
LAB_0013d7bc:
        local_1d8.dims = 3;
        local_1d8.elempack = 1;
        local_1d8.refcount._4_4_ = 0;
        local_1d8.refcount._0_4_ = 0;
        local_1d8.data = (void *)0x0;
        local_198.data = (void *)0x0;
        local_1d8.elemsize = uVar18;
        local_1d8.w = iVar30;
        local_1d8.h = iVar27;
        iVar16 = posix_memalign(&local_198.data,0x10,__size);
        local_1d8.data = local_198.data;
        if (iVar16 != 0) {
          local_198.data = (void *)0x0;
          local_1d8.data = local_198.data;
        }
      }
      else {
        iVar16 = (*(local_1d8.allocator)->_vptr_Allocator[2])(local_1d8.allocator,__size);
        local_1d8.data = (void *)CONCAT44(extraout_var,iVar16);
      }
LAB_0013d7e4:
      local_1d8.refcount = (int *)(uVar32 + (long)local_1d8.data);
      *local_1d8.refcount = 1;
    }
  }
  pDVar14 = local_150;
  iVar16 = -100;
  local_198.refcount = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if ((local_1d8.data == (void *)0x0) ||
     (local_198.refcount = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_),
     (long)local_1d8.c * local_1d8.cstep == 0)) goto LAB_0013e26e;
  uVar17 = local_150->kernel_w * local_150->kernel_h;
  std::vector<int,_std::allocator<int>_>::vector
            (&_space_ofs,(long)(int)uVar17,(allocator_type *)&local_198);
  piVar15 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
  if (0 < pDVar14->kernel_h) {
    iVar16 = pDVar14->dilation_h;
    iVar22 = pDVar14->dilation_w;
    iVar28 = pDVar14->kernel_w;
    iVar20 = 0;
    iVar21 = 0;
    iVar24 = 0;
    do {
      if (0 < pDVar14->kernel_w) {
        lVar26 = 0;
        do {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar20 + lVar26] = iVar21;
          iVar21 = iVar21 + pDVar14->dilation_w;
          lVar26 = lVar26 + 1;
        } while ((int)lVar26 < pDVar14->kernel_w);
        iVar20 = iVar20 + (int)lVar26;
      }
      iVar21 = iVar21 + (iVar16 * iVar30 - iVar22 * iVar28);
      iVar24 = iVar24 + 1;
    } while (iVar24 < pDVar14->kernel_h);
  }
  local_b8 = (long)pDVar14->num_output;
  lVar26 = local_b8;
  if (0 < local_b8) {
    local_a8 = local_1d8.elemsize;
    local_110 = local_1d8.cstep * local_1d8.elemsize;
    local_138 = local_1d8.w;
    _remain = (ulong)(uint)(local_1d8.h * local_1d8.w);
    local_130 = local_150->bias_term;
    local_d8 = (local_150->bias_data).data;
    _size_3 = (ulong)(uint)(iVar27 * iVar30);
    local_118 = (float *)(local_150->activation_params).data;
    local_c8 = (ulong)(local_1d8.h * local_1d8.w + 3U & 0xfffffffc);
    lVar26 = _remain - 1;
    auVar41._8_4_ = (int)lVar26;
    auVar41._0_8_ = lVar26;
    auVar41._12_4_ = (int)((ulong)lVar26 >> 0x20);
    lVar23 = (long)local_1d8.data + 0xc;
    local_134 = uVar3 * uVar17;
    local_148 = 0;
    auVar41 = auVar41 ^ _DAT_0017b060;
    local_108 = (ulong)(local_150->activation_type - 1);
    local_d0 = local_1d8.data;
    lVar29 = 0;
    pvVar25 = local_1d8.data;
    auVar37 = _DAT_0017b040;
    auVar42 = _DAT_0017b050;
    auVar39 = _DAT_0017b060;
    do {
      uVar35 = 0;
      if (local_130 != 0) {
        uVar35 = *(undefined4 *)((long)local_d8 + lVar29 * 4);
      }
      if (0 < remain) {
        uVar18 = 0;
        do {
          auVar38._8_4_ = (int)uVar18;
          auVar38._0_8_ = uVar18;
          auVar38._12_4_ = (int)(uVar18 >> 0x20);
          auVar40 = (auVar38 | auVar42) ^ auVar39;
          iVar16 = auVar41._4_4_;
          if ((bool)(~(iVar16 < auVar40._4_4_ ||
                      auVar41._0_4_ < auVar40._0_4_ && auVar40._4_4_ == iVar16) & 1)) {
            *(undefined4 *)(lVar23 + -0xc + uVar18 * 4) = uVar35;
          }
          if (auVar40._12_4_ <= auVar41._12_4_ &&
              (auVar40._8_4_ <= auVar41._8_4_ || auVar40._12_4_ != auVar41._12_4_)) {
            *(undefined4 *)(lVar23 + -8 + uVar18 * 4) = uVar35;
          }
          auVar38 = (auVar38 | auVar37) ^ auVar39;
          iVar27 = auVar38._4_4_;
          if (iVar27 <= iVar16 && (iVar27 != iVar16 || auVar38._0_4_ <= auVar41._0_4_)) {
            *(undefined4 *)(lVar23 + -4 + uVar18 * 4) = uVar35;
            *(undefined4 *)(lVar23 + uVar18 * 4) = uVar35;
          }
          uVar18 = uVar18 + 4;
        } while (local_c8 != uVar18);
      }
      if (0 < (int)local_e8) {
        local_98 = (void *)(local_110 * lVar29 + (long)local_d0);
        local_12c = local_150->stride_h * local_138;
        local_90 = (long)local_150->stride_w;
        local_88 = (void *)((long)(int)local_148 * 4 + (long)(local_150->weight_data).data);
        local_140 = 0;
        do {
          if (0 < (int)local_e0) {
            iVar16 = local_a0->w;
            sVar6 = local_a0->elemsize;
            sVar7 = local_a0->cstep;
            pvVar8 = local_a0->data;
            uVar18 = 0;
            do {
              if (0 < (int)uVar3) {
                lVar26 = uVar18 * local_90 * 4 + (long)(local_12c * (int)local_140) * local_a8;
                uVar32 = 0;
                pvVar19 = local_88;
                do {
                  if (0 < (int)uVar17) {
                    fVar36 = *(float *)((long)pvVar8 +
                                       sVar7 * sVar6 * uVar32 +
                                       uVar18 * 4 + (long)iVar16 * local_140 * sVar6);
                    uVar31 = 0;
                    do {
                      *(float *)((long)local_98 + (long)piVar15[uVar31] * 4 + lVar26) =
                           *(float *)((long)pvVar19 + uVar31 * 4) * fVar36 +
                           *(float *)((long)local_98 + (long)piVar15[uVar31] * 4 + lVar26);
                      uVar31 = uVar31 + 1;
                    } while (uVar17 != uVar31);
                  }
                  uVar32 = uVar32 + 1;
                  pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar17 * 4);
                } while (uVar32 != uVar3);
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != local_e0);
          }
          local_140 = local_140 + 1;
        } while (local_140 != local_e8);
      }
      local_100 = lVar29;
      local_f0 = pvVar25;
      local_b0 = lVar23;
      if ((uint)local_108 < 4) {
        iVar16 = (int)_size_3;
        switch((long)&switchD_0013dc81::switchdataD_0017cc50 +
               (long)(int)(&switchD_0013dc81::switchdataD_0017cc50)[local_108]) {
        case 0x13dc83:
          if (0 < iVar16) {
            uVar18 = 0;
            do {
              fVar36 = *(float *)((long)pvVar25 + uVar18 * 4);
              if (fVar36 <= 0.0) {
                fVar36 = 0.0;
              }
              *(float *)((long)pvVar25 + uVar18 * 4) = fVar36;
              uVar18 = uVar18 + 1;
            } while (_size_3 != uVar18);
          }
          break;
        case 0x13dcad:
          if (0 < iVar16) {
            fVar36 = *local_118;
            fVar2 = local_118[1];
            uVar18 = 0;
            do {
              pfVar1 = (float *)((long)pvVar25 + uVar18 * 4);
              if (*pfVar1 <= fVar36 && fVar36 != *pfVar1) {
                *(float *)((long)pvVar25 + uVar18 * 4) = fVar36;
              }
              if (fVar2 < *(float *)((long)pvVar25 + uVar18 * 4)) {
                *(float *)((long)pvVar25 + uVar18 * 4) = fVar2;
              }
              uVar18 = uVar18 + 1;
            } while (_size_3 != uVar18);
          }
          break;
        case 0x13dcec:
          if (0 < iVar16) {
            uVar18 = 0;
            do {
              fVar36 = expf((float)(*(uint *)((long)local_f0 + uVar18 * 4) ^ auVar39._0_4_));
              auVar39 = _DAT_0017b060;
              auVar42 = _DAT_0017b050;
              auVar37 = _DAT_0017b040;
              *(float *)((long)local_f0 + uVar18 * 4) = 1.0 / (fVar36 + 1.0);
              uVar18 = uVar18 + 1;
            } while (_size_3 != uVar18);
          }
          break;
        case 0x13dd5f:
          if (0 < iVar16) {
            fVar36 = *local_118;
            uVar18 = 0;
            do {
              fVar2 = *(float *)((long)pvVar25 + uVar18 * 4);
              uVar34 = -(uint)(0.0 < fVar2);
              *(float *)((long)pvVar25 + uVar18 * 4) =
                   (float)(~uVar34 & (uint)fVar36 | uVar34 & 0x3f800000) * fVar2;
              uVar18 = uVar18 + 1;
            } while (_size_3 != uVar18);
          }
        }
      }
      lVar29 = local_100 + 1;
      lVar23 = local_b0 + local_110;
      local_148 = (ulong)(uint)((int)local_148 + local_134);
      pvVar25 = (void *)((long)local_f0 + local_110);
      lVar26 = local_110;
    } while (lVar29 != local_b8);
  }
  dst = local_120;
  opt_00 = local_128;
  pDVar14 = local_150;
  uVar13 = local_198.elemsize._4_4_;
  uVar35 = (undefined4)local_198.elemsize;
  auVar40._0_4_ = -(uint)(0 < local_150->pad_left);
  auVar40._4_4_ = -(uint)(0 < local_150->pad_right);
  auVar40._8_4_ = -(uint)(0 < local_150->pad_top);
  auVar40._12_4_ = -(uint)(0 < local_150->pad_bottom);
  iVar16 = movmskps((int)lVar26,auVar40);
  local_198.elemsize._0_4_ = (undefined4)local_1d8.elemsize;
  local_198.elemsize._4_4_ = (undefined4)(local_1d8.elemsize >> 0x20);
  local_198.refcount = local_1d8.refcount;
  if (iVar16 == 0) {
    if ((local_150->output_w < 1) || (local_150->output_h < 1)) {
      local_198.elemsize._0_4_ = uVar35;
      local_198.elemsize._4_4_ = uVar13;
      if (local_150->output_pad_bottom < 1 && local_150->output_pad_right < 1) {
        Mat::operator=(local_120,&local_1d8);
        piVar4 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      }
      else {
        copy_make_border(&local_1d8,local_120,0,local_150->output_pad_bottom,0,
                         local_150->output_pad_right,0,0.0,local_128);
        piVar4 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        iVar16 = -100;
        local_198.refcount = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
        if ((dst->data == (void *)0x0) ||
           (local_198.refcount = piVar4, (long)dst->c * dst->cstep == 0)) goto LAB_0013e251;
      }
LAB_0013e213:
      iVar16 = 0;
      local_198.refcount = piVar4;
    }
    else {
      local_198.data = local_1d8.data;
      local_198.elempack = local_1d8.elempack;
      local_198.allocator = local_1d8.allocator;
      local_198.w = local_1d8.w;
      local_198.dims = local_1d8.dims;
      local_198.c = local_1d8.c;
      local_198.h = local_1d8.h;
      local_198.cstep = local_1d8.cstep;
      if (local_1d8.refcount != (int *)0x0) {
        LOCK();
        *local_1d8.refcount = *local_1d8.refcount + 1;
        UNLOCK();
      }
      if (local_150->output_pad_bottom < 1 && local_150->output_pad_right < 1) {
LAB_0013e05a:
        iVar27 = local_198.w - pDVar14->output_w;
        iVar16 = local_198.h - pDVar14->output_h;
        if ((pDVar14->pad_left == -0xe9) ||
           (((pDVar14->pad_right == -0xe9 || (pDVar14->pad_top == -0xe9)) ||
            (pDVar14->pad_bottom == -0xe9)))) {
          iVar22 = iVar16 / 2;
          iVar30 = iVar16 - iVar22;
          iVar28 = iVar27 / 2;
          iVar16 = iVar27 - iVar28;
LAB_0013e0d1:
          copy_cut_border(&local_198,dst,iVar22,iVar30,iVar28,iVar16,opt_00);
        }
        else if ((pDVar14->pad_top == -0xea ||
                 (pDVar14->pad_right == -0xea || pDVar14->pad_left == -0xea)) ||
                 pDVar14->pad_bottom == -0xea) {
          iVar30 = iVar16 / 2;
          iVar22 = iVar16 - iVar30;
          iVar16 = iVar27 / 2;
          iVar28 = iVar27 - iVar16;
          goto LAB_0013e0d1;
        }
        if (dst->data != (void *)0x0) {
          iVar16 = dst->c;
          sVar6 = dst->cstep;
          Mat::~Mat(&local_198);
          piVar4 = local_198.refcount;
          if ((long)iVar16 * sVar6 == 0) goto LAB_0013e24b;
          goto LAB_0013e213;
        }
      }
      else {
        opt_b.use_int8_arithmetic = local_128->use_int8_arithmetic;
        opt_b.use_packing_layout = local_128->use_packing_layout;
        opt_b._34_6_ = *(undefined6 *)&local_128->field_0x22;
        opt_b.lightmode = local_128->lightmode;
        opt_b._1_3_ = *(undefined3 *)&local_128->field_0x1;
        opt_b.num_threads = local_128->num_threads;
        opt_b.workspace_allocator = local_128->workspace_allocator;
        opt_b.use_winograd_convolution = local_128->use_winograd_convolution;
        opt_b.use_sgemm_convolution = local_128->use_sgemm_convolution;
        opt_b.use_int8_inference = local_128->use_int8_inference;
        opt_b.use_vulkan_compute = local_128->use_vulkan_compute;
        opt_b.use_fp16_packed = local_128->use_fp16_packed;
        opt_b.use_fp16_storage = local_128->use_fp16_storage;
        opt_b.use_fp16_arithmetic = local_128->use_fp16_arithmetic;
        opt_b.use_int8_storage = local_128->use_int8_storage;
        opt_b.blob_allocator = local_128->workspace_allocator;
        copy_make_border(&local_1d8,&local_198,0,local_150->output_pad_bottom,0,
                         local_150->output_pad_right,0,0.0,&opt_b);
        if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0))
        goto LAB_0013e05a;
      }
      Mat::~Mat(&local_198);
LAB_0013e24b:
      iVar16 = -100;
    }
  }
  else {
    local_198.data = local_1d8.data;
    local_198.elempack = local_1d8.elempack;
    local_198.allocator = local_1d8.allocator;
    local_198.w = local_1d8.w;
    local_198.dims = local_1d8.dims;
    local_198.h = local_1d8.h;
    local_198.c = local_1d8.c;
    local_198.cstep = local_1d8.cstep;
    if (local_1d8.refcount != (int *)0x0) {
      LOCK();
      *local_1d8.refcount = *local_1d8.refcount + 1;
      UNLOCK();
    }
    if (0 < local_150->output_pad_bottom || 0 < local_150->output_pad_right) {
      opt_b.use_int8_arithmetic = local_128->use_int8_arithmetic;
      opt_b.use_packing_layout = local_128->use_packing_layout;
      opt_b._34_6_ = *(undefined6 *)&local_128->field_0x22;
      opt_b.lightmode = local_128->lightmode;
      opt_b._1_3_ = *(undefined3 *)&local_128->field_0x1;
      opt_b.num_threads = local_128->num_threads;
      opt_b.workspace_allocator = local_128->workspace_allocator;
      opt_b.use_winograd_convolution = local_128->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_128->use_sgemm_convolution;
      opt_b.use_int8_inference = local_128->use_int8_inference;
      opt_b.use_vulkan_compute = local_128->use_vulkan_compute;
      opt_b.use_fp16_packed = local_128->use_fp16_packed;
      opt_b.use_fp16_storage = local_128->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_128->use_fp16_arithmetic;
      opt_b.use_int8_storage = local_128->use_int8_storage;
      opt_b.blob_allocator = local_128->workspace_allocator;
      copy_make_border(&local_1d8,&local_198,0,local_150->output_pad_bottom,0,
                       local_150->output_pad_right,0,0.0,&opt_b);
      if ((local_198.data == (void *)0x0) || ((long)local_198.c * local_198.cstep == 0)) {
        if (local_198.refcount != (int *)0x0) {
          LOCK();
          *local_198.refcount = *local_198.refcount + -1;
          UNLOCK();
          if (*local_198.refcount == 0) {
            if (local_198.allocator == (Allocator *)0x0) {
              if (local_198.data != (void *)0x0) {
                free(local_198.data);
              }
            }
            else {
              (*(local_198.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_198.elemsize._0_4_ = 0;
        local_198.elemsize._4_4_ = 0;
        local_198.elempack = 0;
        local_198.data = (void *)0x0;
        local_198.refcount = (int *)0x0;
        local_198.dims = 0;
        local_198.w = 0;
        local_198.h = 0;
        local_198.c = 0;
        local_198.cstep = 0;
        goto LAB_0013e24b;
      }
    }
    copy_cut_border(&local_198,dst,pDVar14->pad_top,pDVar14->pad_bottom,pDVar14->pad_left,
                    pDVar14->pad_right,opt_00);
    if (dst->data == (void *)0x0) {
      bVar33 = false;
    }
    else {
      bVar33 = (long)dst->c * dst->cstep != 0;
    }
    if (local_198.refcount != (int *)0x0) {
      LOCK();
      *local_198.refcount = *local_198.refcount + -1;
      UNLOCK();
      if (*local_198.refcount == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          if (local_198.data != (void *)0x0) {
            free(local_198.data);
          }
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.data = (void *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.c = 0;
    local_198.cstep = 0;
    iVar16 = -100;
    local_198.refcount = (int *)0x0;
    piVar4 = (int *)0x0;
    if (bVar33) goto LAB_0013e213;
  }
LAB_0013e251:
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0013e26e:
  if (local_1d8.refcount != (int *)0x0) {
    LOCK();
    *local_1d8.refcount = *local_1d8.refcount + -1;
    UNLOCK();
    if (*local_1d8.refcount == 0) {
      if (local_1d8.allocator == (Allocator *)0x0) {
        if (local_1d8.data != (void *)0x0) {
          free(local_1d8.data);
        }
      }
      else {
        (*(local_1d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar16;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || output_pad_right > 0 || output_pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = 1.f / (1.f + exp(-outptr[i]));
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        copy_cut_border(top_blob_bordered_adj, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else if (output_w > 0 && output_h > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        int wcut = top_blob_bordered_adj.w - output_w;
        int hcut = top_blob_bordered_adj.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            copy_make_border(top_blob_bordered, top_blob, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt);
            if (top_blob.empty())
                return -100;
        }
        else
        {
            top_blob = top_blob_bordered;
        }
    }

    return 0;
}